

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

uint OrdinalUnsignedToIgnoreCase(uint c,uint maximum_singleton_value)

{
  ON__UINT32 OVar1;
  
  OVar1 = MapCodePointOrdinal(c,maximum_singleton_value,
                              (0x79 < maximum_singleton_value && c - 0x41 < 0x3a) ^ MinimumOrdinal);
  return OVar1;
}

Assistant:

static unsigned int OrdinalUnsignedToIgnoreCase(
  unsigned int c,
  unsigned int maximum_singleton_value
  )
{
  // RH-41224
  // map A -> a, ..., Z -> z so underbar is before any "letter".
  // The preserves the behavior of Rhino component name sorting
  // that used "ancient" C runtime ASCII sorts.
  const ON_StringMapOrdinalType map_type
    = ( c <= 0x7A && c >= 0x41 && maximum_singleton_value >= 0x7A )
    ? ON_StringMapOrdinalType::LowerOrdinal
    : ON_StringMapOrdinalType::MinimumOrdinal;
  return MapCodePointOrdinal(c, maximum_singleton_value, map_type);
}